

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry *
NscBuildConditional(CNscPStackEntry *pSelect,CNscPStackEntry *p1,CNscPStackEntry *p2)

{
  NscType NVar1;
  CNwnDoubleLinkList *pCVar2;
  CNscPStackEntry *pCVar3;
  CNscContext *pCVar4;
  CNscPStackEntry *this;
  CNwnDoubleLinkList *pCVar5;
  int nFile4;
  CNwnDoubleLinkList *pNext;
  size_t nBlock4Size;
  NscMessage nMessage;
  uchar *pauchBlock5;
  int nLine5;
  size_t nBlock5Size;
  int nFile5;
  int nLine4;
  uchar *pauchBlock4;
  int local_48;
  int local_44;
  uchar *local_40;
  size_t local_38;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar4 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pSelect != (CNscPStackEntry *)0x0) {
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(pSelect->m_link).m_pNext;
      if (pCVar3 != pSelect) {
        pCVar5 = (pSelect->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (pSelect->m_link).m_pNext = &pSelect->m_link;
        (pSelect->m_link).m_pPrev = &pSelect->m_link;
      }
      pCVar5 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pSelect) {
        pCVar5 = pCVar2;
      }
      pCVar2 = pCVar5->m_pNext;
      (pSelect->m_link).m_pNext = pCVar2;
      (pSelect->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &pSelect->m_link;
      pCVar2->m_pPrev = &pSelect->m_link;
    }
    pCVar4 = g_pCtx;
    if (p1 != (CNscPStackEntry *)0x0) {
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(p1->m_link).m_pNext;
      if (pCVar3 != p1) {
        pCVar5 = (p1->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (p1->m_link).m_pNext = &p1->m_link;
        (p1->m_link).m_pPrev = &p1->m_link;
      }
      pCVar5 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == p1) {
        pCVar5 = pCVar2;
      }
      pCVar2 = pCVar5->m_pNext;
      (p1->m_link).m_pNext = pCVar2;
      (p1->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &p1->m_link;
      pCVar2->m_pPrev = &p1->m_link;
    }
    pCVar4 = g_pCtx;
    if (p2 != (CNscPStackEntry *)0x0) {
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(p2->m_link).m_pNext;
      if (pCVar3 != p2) {
        pCVar5 = (p2->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (p2->m_link).m_pNext = &p2->m_link;
        (p2->m_link).m_pPrev = &p2->m_link;
      }
      pCVar5 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == p2) {
        pCVar5 = pCVar2;
      }
      pCVar2 = pCVar5->m_pNext;
      (p2->m_link).m_pNext = pCVar2;
      (p2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &p2->m_link;
      pCVar2->m_pPrev = &p2->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Unknown;
      return this;
    }
  }
  else {
    if (((pSelect->m_nType != NscType_Error) && (NVar1 = p1->m_nType, NVar1 != NscType_Error)) &&
       (p2->m_nType != NscType_Error)) {
      if (pSelect->m_nType == NscType_Integer) {
        if (NVar1 == p2->m_nType) {
          nLine4 = -1;
          if (pSelect == (CNscPStackEntry *)0x0) {
            local_38 = 0;
            local_44 = -1;
            local_48 = -1;
            local_40 = (uchar *)0x0;
          }
          else {
            local_40 = pSelect->m_pauchData;
            local_38 = pSelect->m_nDataSize;
            local_44 = g_pCtx->m_anFileNumbers[0];
            local_48 = g_pCtx->m_anLineNumbers[0];
          }
          if (p1 == (CNscPStackEntry *)0x0) {
            pauchBlock4 = (uchar *)0x0;
            nFile4 = -1;
            nBlock4Size = 0;
          }
          else {
            pauchBlock4 = p1->m_pauchData;
            nBlock4Size = p1->m_nDataSize;
            nFile4 = g_pCtx->m_anFileNumbers[0];
            nLine4 = g_pCtx->m_anLineNumbers[0];
          }
          if (p2 == (CNscPStackEntry *)0x0) {
            nLine5 = -1;
            pauchBlock5 = (uchar *)0x0;
            nFile5 = -1;
            nBlock5Size = 0;
          }
          else {
            pauchBlock5 = p2->m_pauchData;
            nBlock5Size = p2->m_nDataSize;
            nFile5 = g_pCtx->m_anFileNumbers[0];
            nLine5 = g_pCtx->m_anLineNumbers[0];
          }
          if (this->m_nType != NscType_Unknown) goto LAB_00152217;
          this->m_nType = NVar1;
          CNscPStackEntry::Push5Block
                    (this,NscPCode_Conditional,p1->m_nType,(uchar *)0x0,0,-1,-1,local_40,local_38,
                     local_44,local_48,(uchar *)0x0,0,-1,-1,pauchBlock4,nBlock4Size,nFile4,nLine4,
                     pauchBlock5,nBlock5Size,nFile5,nLine5);
          goto LAB_00152014;
        }
        nMessage = NscMessage_ErrorConditionalResultTypesBad;
      }
      else {
        nMessage = NscMessage_ErrorConditionalRequiresInt;
      }
      CNscContext::GenerateMessage(g_pCtx,nMessage);
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Error;
LAB_00152014:
      pCVar4 = g_pCtx;
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(pSelect->m_link).m_pNext;
      if (pCVar3 != pSelect) {
        pCVar5 = (pSelect->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (pSelect->m_link).m_pNext = &pSelect->m_link;
        (pSelect->m_link).m_pPrev = &pSelect->m_link;
      }
      pCVar5 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pSelect) {
        pCVar5 = pCVar2;
      }
      pCVar2 = pCVar5->m_pNext;
      (pSelect->m_link).m_pNext = pCVar2;
      (pSelect->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &pSelect->m_link;
      pCVar2->m_pPrev = &pSelect->m_link;
      pCVar4 = g_pCtx;
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(p1->m_link).m_pNext;
      if (pCVar3 != p1) {
        pCVar5 = (p1->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (p1->m_link).m_pNext = &p1->m_link;
        (p1->m_link).m_pPrev = &p1->m_link;
      }
      pCVar5 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == p1) {
        pCVar5 = pCVar2;
      }
      pCVar2 = pCVar5->m_pNext;
      (p1->m_link).m_pNext = pCVar2;
      (p1->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &p1->m_link;
      pCVar2->m_pPrev = &p1->m_link;
      pCVar4 = g_pCtx;
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(p2->m_link).m_pNext;
      if (pCVar3 != p2) {
        pCVar5 = (p2->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (p2->m_link).m_pNext = &p2->m_link;
        (p2->m_link).m_pPrev = &p2->m_link;
      }
      pCVar5 = &pCVar4->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == p2) {
        pCVar5 = pCVar2;
      }
      pCVar2 = pCVar5->m_pNext;
      (p2->m_link).m_pNext = pCVar2;
      (p2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &p2->m_link;
      pCVar2->m_pPrev = &p2->m_link;
      return this;
    }
  }
LAB_00152217:
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildConditional (YYSTYPE pSelect, YYSTYPE p1, YYSTYPE p2)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pSelect)
			g_pCtx ->FreePStackEntry (pSelect);
		if (p1)
			g_pCtx ->FreePStackEntry (p1);
		if (p2)
			g_pCtx ->FreePStackEntry (p2);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Check for silent errors
	//

	if (pSelect ->GetType () == NscType_Error ||
		p1 ->GetType () == NscType_Error ||
		p2 ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Validate the types
	//

	else if (pSelect ->GetType () != NscType_Integer)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorConditionalRequiresInt);
		pOut ->SetType (NscType_Error);
	}
	else if (p1 ->GetType () != p2 ->GetType ())
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorConditionalResultTypesBad);
		pOut ->SetType (NscType_Error);
	}

	//
	// Generate the codes
	//

	else
	{
		CNsc5BlockHelper sBlock2 (pSelect, NULL, 1);
		CNsc5BlockHelper sBlock4 (p1, NULL, 3);
		CNsc5BlockHelper sBlock5 (p2, NULL, 4);

		pOut ->SetType (p1 ->GetType ());
		pOut ->Push5Block (NscPCode_Conditional, p1 ->GetType (),
			NULL, 0, -1, -1,
			sBlock2 .m_pauchData, sBlock2 .m_ulSize, sBlock2 .m_nFile, sBlock2 .m_nLine,
			NULL, 0, -1, -1, 
			sBlock4 .m_pauchData, sBlock4 .m_ulSize, sBlock4 .m_nFile, sBlock4 .m_nLine,
			sBlock5 .m_pauchData, sBlock5 .m_ulSize, sBlock5 .m_nFile, sBlock5 .m_nLine);
	}

	//
	// Return results
	//

	g_pCtx ->FreePStackEntry (pSelect);
	g_pCtx ->FreePStackEntry (p1);
	g_pCtx ->FreePStackEntry (p2);
	return pOut;
}